

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  Shape *pSVar1;
  char *in_RCX;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  allocator<char> local_69;
  t_type_info<Square> local_68;
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  h;
  
  h.m_registered_types.
  super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  h.m_registered_types.
  super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  h.m_registered_types.
  super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name._M_str = in_RCX;
  name._M_len = (size_t)"sq";
  trex::make_type_info<Square>(&local_68,(trex *)0x2,name);
  trex::
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::register_type<Square>(&h,&local_68);
  name_00._M_str = in_RCX;
  name_00._M_len = (size_t)"ci";
  trex::make_type_info<Circle>((t_type_info<Circle> *)&local_68,(trex *)0x2,name_00);
  trex::
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::register_type<Circle>(&h,(t_type_info<Circle> *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"asd",&local_69);
  name_01._M_str = "sq";
  name_01._M_len = 2;
  pSVar1 = trex::
           hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::alloc_and_construct
                     (&h,name_01,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68
                     );
  std::__cxx11::string::~string((string *)&local_68);
  (*pSVar1->_vptr_Shape[1])(pSVar1,&std::cout);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"cici",&local_69);
  name_02._M_str = "ci";
  name_02._M_len = 2;
  pSVar1 = trex::
           hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::alloc_and_construct
                     (&h,name_02,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68
                     );
  std::__cxx11::string::~string((string *)&local_68);
  (*pSVar1->_vptr_Shape[1])(pSVar1,&std::cout);
  std::
  _Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
  ::~_Vector_base(&h.m_registered_types.
                   super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
                 );
  return 0;
}

Assistant:

int main()
{
    trex::hierarchy<Shape, std::string> h;
    h.register_type(trex::make_type_info<Square>("sq"));
    h.register_type(trex::make_type_info<Circle>("ci"));

    auto c = h.alloc_and_construct("sq", "asd");
    c->log(std::cout);

    c = h.alloc_and_construct("ci", "cici");
    c->log(std::cout);

    return 0;
}